

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlackCard.cpp
# Opt level: O2

void __thiscall BlackCard::PrintCardStats(BlackCard *this)

{
  long lVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  string *psVar6;
  string *psVar7;
  ostream *poVar8;
  char *pcVar9;
  Type *pTVar10;
  
  if (this->type != HOLDING) {
    if (this->type == PERSONALITY) {
      Personality::PrintPersonality((Personality *)this);
      return;
    }
    exit(-1);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar5 = std::operator<<(poVar5,(string *)(this + 1));
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Cost: ");
  iVar3 = (*(this->super_Card)._vptr_Card[4])(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"Holding Type: ");
  uVar4 = *(int *)((long)&this[1].super_Card.name.field_2 + 8) - 1;
  if (5 < uVar4) {
    return;
  }
  poVar8 = (ostream *)&std::cout;
  poVar5 = std::operator<<((ostream *)&std::cout,
                           &DAT_0010e884 + *(int *)(&DAT_0010e884 + (ulong)uVar4 * 4));
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar9 = "Tapped: no";
  if ((char)this[1].super_Card.cost != '\0') {
    pcVar9 = "Tapped: yes";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar9 = "Revealed: no";
  if (*(char *)((long)&this[1].super_Card.cost + 1) != '\0') {
    pcVar9 = "Revealed: yes";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Harvest Value: ");
  iVar3 = (*(this->super_Card)._vptr_Card[7])(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar1 = *(long *)&this[1].super_Card.type;
  pcVar2 = this[1].name._M_dataplus._M_p;
  if (lVar1 == 0 && pcVar2 == (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Holding is not in a chain");
    poVar8 = std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0010a93f;
  }
  psVar6 = &this[1].name;
  if (lVar1 == 0) {
    if (*(long *)(pcVar2 + 0xa0) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Holding connected with the subHolding ");
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
      psVar7 = getName_abi_cxx11_((BlackCard *)(psVar6->_M_dataplus)._M_p);
      poVar5 = std::operator<<(poVar5,(string *)psVar7);
      poVar5 = std::operator<<(poVar5,"and ");
      psVar6 = (string *)((psVar6->_M_dataplus)._M_p + 0xa0);
    }
  }
  else {
    pTVar10 = &this[1].super_Card.type;
    if (pcVar2 == (pointer)0x0) {
      if (*(long *)(lVar1 + 0x98) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
        psVar6 = getName_abi_cxx11_(*(BlackCard **)pTVar10);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"and ");
        psVar6 = (string *)(*(long *)pTVar10 + 0x98);
        goto LAB_0010a924;
      }
      poVar5 = (ostream *)&std::cout;
      pcVar9 = "Holding connected with the upperholding ";
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
      psVar6 = getName_abi_cxx11_((BlackCard *)(psVar6->_M_dataplus)._M_p);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      pcVar9 = "and ";
    }
    poVar5 = std::operator<<(poVar5,pcVar9);
    psVar6 = (string *)pTVar10;
  }
LAB_0010a924:
  psVar6 = getName_abi_cxx11_((BlackCard *)(psVar6->_M_dataplus)._M_p);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010a93f:
  std::endl<char,std::char_traits<char>>(poVar8);
  return;
}

Assistant:

void BlackCard::PrintCardStats()                                //defines type of card and calls proper print function for that type
{
    if (type == PERSONALITY)
    {
        Personality* pers = reinterpret_cast<Personality*>(this);
        pers->PrintPersonality();

        pers = nullptr;
        delete pers;
    }
    else if (type == HOLDING)
    {
        Holding * hold = reinterpret_cast<Holding*>(this);
        hold->PrintHolding();

        hold = nullptr;
        delete hold;
    }
    else
        exit(-1);
}